

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

void characterIteratorSetState(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  long *plVar1;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return;
  }
  if ((iter != (UCharIterator *)0x0) && (plVar1 = (long *)iter->context, plVar1 != (long *)0x0)) {
    if (((int)plVar1[2] <= (int)state) && ((int)state <= *(int *)((long)plVar1 + 0x14))) {
      (**(code **)(*plVar1 + 0x78))();
      return;
    }
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

static void U_CALLCONV
characterIteratorSetState(UCharIterator *iter, uint32_t state, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL || iter->context==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if((int32_t)state<((CharacterIterator *)(iter->context))->startIndex() || ((CharacterIterator *)(iter->context))->endIndex()<(int32_t)state) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    } else {
        ((CharacterIterator *)(iter->context))->setIndex((int32_t)state);
    }
}